

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

float float32_unpack(uint32 x)

{
  float fVar1;
  double dVar2;
  
  dVar2 = (double)(x & 0x1fffff);
  if ((int)x < 0) {
    dVar2 = (double)((ulong)dVar2 | (ulong)DAT_0017f0e0);
  }
  fVar1 = ldexpf((float)dVar2,(x >> 0x15 & 0x3ff) - 0x314);
  return fVar1;
}

Assistant:

static float float32_unpack(uint32 x)
{
   // from the specification
   uint32 mantissa = x & 0x1fffff;
   uint32 sign = x & 0x80000000;
   uint32 exp = (x & 0x7fe00000) >> 21;
   double res = sign ? -(double)mantissa : (double)mantissa;
   return (float) ldexp((float)res, (int)exp-788);
}